

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write-cmake.cpp
# Opt level: O0

bool CMakeWriter::write_text_to_file_if_contents_changed
               (StringBuilder *sb,char *text,char *filename)

{
  undefined8 uVar1;
  int local_44;
  string local_40 [3];
  char c;
  int i;
  string escaped_text;
  char *filename_local;
  char *text_local;
  StringBuilder *sb_local;
  
  std::__cxx11::string::string(local_40);
  for (local_44 = 0; text[local_44] != '\0'; local_44 = local_44 + 1) {
    if (text[local_44] == '\"') {
      std::__cxx11::string::push_back((char)local_40);
      std::__cxx11::string::push_back((char)local_40);
    }
    else {
      std::__cxx11::string::push_back((char)local_40);
    }
  }
  uVar1 = std::__cxx11::string::c_str();
  chibi::StringBuilder::AppendFormat(sb,"file(WRITE \"%s.txt\" \"%s\")\n",filename,uVar1);
  chibi::StringBuilder::AppendFormat(sb,"file(GENERATE OUTPUT \"%s\" INPUT \"%s.txt\")\n",filename);
  chibi::StringBuilder::Append(sb,"\n");
  std::__cxx11::string::~string(local_40);
  return true;
}

Assistant:

static bool write_text_to_file_if_contents_changed(StringBuilder & sb, const char * text, const char * filename)
	{
		// escape the text so we can use 'file(WRITE ..)' from cmake to create the actual file inside the right directory
		
		std::string escaped_text;
		
		for (int i = 0; text[i] != 0; ++i)
		{
			const char c = text[i];

			if (c == '"')
			{
				escaped_text.push_back('\\');
				escaped_text.push_back('"');
			}
			else
				escaped_text.push_back(c);
		}

		sb.AppendFormat("file(WRITE \"%s.txt\" \"%s\")\n", filename, escaped_text.c_str());
		sb.AppendFormat("file(GENERATE OUTPUT \"%s\" INPUT \"%s.txt\")\n", filename, filename);
		sb.Append("\n");

		return true;
	}